

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void google::protobuf::MessageFactory::InternalRegisterGeneratedFile
               (char *filename,RegistrationFunc *register_messages)

{
  GeneratedMessageFactory *this;
  RegistrationFunc *register_messages_local;
  char *filename_local;
  
  this = anon_unknown_1::GeneratedMessageFactory::singleton();
  anon_unknown_1::GeneratedMessageFactory::RegisterFile(this,filename,register_messages);
  return;
}

Assistant:

void MessageFactory::InternalRegisterGeneratedFile(
    const char* filename, void (*register_messages)(const string&)) {
  GeneratedMessageFactory::singleton()->RegisterFile(filename,
                                                     register_messages);
}